

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_msa_st_b_mips(CPUMIPSState *env,uint32_t wd,target_ulong_conflict addr)

{
  int mmu_idx_00;
  uint idx;
  TCGMemOpIdx oi_00;
  fpr_t *pfVar1;
  uintptr_t unaff_retaddr;
  TCGMemOpIdx oi;
  int mmu_idx;
  wr_t *pwd;
  target_ulong_conflict addr_local;
  uint32_t wd_local;
  CPUMIPSState *env_local;
  
  pfVar1 = (env->active_fpu).fpr + wd;
  mmu_idx_00 = cpu_mmu_index(env,false);
  idx = cpu_mmu_index(env,false);
  oi_00 = make_memop_idx(MO_AMASK|MO_BE,idx);
  ensure_writable_pages(env,addr,mmu_idx_00,unaff_retaddr);
  helper_ret_stb_mmu_mips((CPUArchState_conflict5 *)env,addr,*(uint8_t *)pfVar1,oi_00,unaff_retaddr)
  ;
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 1,*(uint8_t *)((long)pfVar1 + 1),oi_00,
             unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 2,*(uint8_t *)((long)pfVar1 + 2),oi_00,
             unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 3,*(uint8_t *)((long)pfVar1 + 3),oi_00,
             unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 4,*(uint8_t *)((long)pfVar1 + 4),oi_00,
             unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 5,*(uint8_t *)((long)pfVar1 + 5),oi_00,
             unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 6,*(uint8_t *)((long)pfVar1 + 6),oi_00,
             unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 7,*(uint8_t *)((long)pfVar1 + 7),oi_00,
             unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 8,*(uint8_t *)((long)pfVar1 + 8),oi_00,
             unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 9,*(uint8_t *)((long)pfVar1 + 9),oi_00,
             unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 10,*(uint8_t *)((long)pfVar1 + 10),oi_00,
             unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 0xb,*(uint8_t *)((long)pfVar1 + 0xb),oi_00,
             unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 0xc,*(uint8_t *)((long)pfVar1 + 0xc),oi_00,
             unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 0xd,*(uint8_t *)((long)pfVar1 + 0xd),oi_00,
             unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 0xe,*(uint8_t *)((long)pfVar1 + 0xe),oi_00,
             unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 0xf,*(uint8_t *)((long)pfVar1 + 0xf),oi_00,
             unaff_retaddr);
  return;
}

Assistant:

void helper_msa_st_b(CPUMIPSState *env, uint32_t wd,
                     target_ulong addr)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    int mmu_idx = cpu_mmu_index(env, false);

    MEMOP_IDX(DF_BYTE)
    ensure_writable_pages(env, addr, mmu_idx, GETPC());
#if !defined(HOST_WORDS_BIGENDIAN)
    helper_ret_stb_mmu(env, addr + (0  << DF_BYTE), pwd->b[0],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (1  << DF_BYTE), pwd->b[1],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (2  << DF_BYTE), pwd->b[2],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (3  << DF_BYTE), pwd->b[3],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (4  << DF_BYTE), pwd->b[4],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (5  << DF_BYTE), pwd->b[5],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (6  << DF_BYTE), pwd->b[6],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (7  << DF_BYTE), pwd->b[7],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (8  << DF_BYTE), pwd->b[8],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (9  << DF_BYTE), pwd->b[9],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (10 << DF_BYTE), pwd->b[10], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (11 << DF_BYTE), pwd->b[11], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (12 << DF_BYTE), pwd->b[12], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (13 << DF_BYTE), pwd->b[13], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (14 << DF_BYTE), pwd->b[14], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (15 << DF_BYTE), pwd->b[15], oi, GETPC());
#else
    helper_ret_stb_mmu(env, addr + (7  << DF_BYTE), pwd->b[0],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (6  << DF_BYTE), pwd->b[1],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (5  << DF_BYTE), pwd->b[2],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (4  << DF_BYTE), pwd->b[3],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (3  << DF_BYTE), pwd->b[4],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (2  << DF_BYTE), pwd->b[5],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (1  << DF_BYTE), pwd->b[6],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (0  << DF_BYTE), pwd->b[7],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (15 << DF_BYTE), pwd->b[8],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (14 << DF_BYTE), pwd->b[9],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (13 << DF_BYTE), pwd->b[10], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (12 << DF_BYTE), pwd->b[11], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (11 << DF_BYTE), pwd->b[12], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (10 << DF_BYTE), pwd->b[13], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (9  << DF_BYTE), pwd->b[14], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (8  << DF_BYTE), pwd->b[15], oi, GETPC());
#endif
}